

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_rand(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_value *pjVar2;
  uint uVar3;
  anon_union_8_3_18420de5_for_x aVar4;
  sxu32 iNum;
  uint local_2c;
  
  SyRandomness(&pCtx->pVm->sPrng,&local_2c,4);
  if (1 < nArg) {
    pjVar2 = *apArg;
    jx9MemObjToInteger(pjVar2);
    uVar1 = *(uint *)&pjVar2->x;
    pjVar2 = apArg[1];
    jx9MemObjToInteger(pjVar2);
    uVar3 = *(uint *)&pjVar2->x;
    if (uVar1 < uVar3) {
      uVar3 = (uVar3 + 1) - uVar1;
      if (uVar3 != 0) {
        local_2c = local_2c % uVar3 + uVar1;
      }
    }
    else if (uVar3 != 0) {
      local_2c = local_2c % uVar3;
    }
  }
  aVar4.iVal._4_4_ = 0;
  aVar4.iVal._0_4_ = local_2c;
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  pjVar2->x = aVar4;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int vm_builtin_rand(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	sxu32 iNum;
	/* Generate the random number */
	iNum = jx9VmRandomNum(pCtx->pVm);
	if( nArg > 1 ){
		sxu32 iMin, iMax;
		iMin = (sxu32)jx9_value_to_int(apArg[0]);
		iMax = (sxu32)jx9_value_to_int(apArg[1]);
		if( iMin < iMax ){
			sxu32 iDiv = iMax+1-iMin;
			if( iDiv > 0 ){
				iNum = (iNum % iDiv)+iMin;
			}
		}else if(iMax > 0 ){
			iNum %= iMax;
		}
	}
	/* Return the number */
	jx9_result_int64(pCtx, (jx9_int64)iNum);
	return SXRET_OK;
}